

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_application_blob_link
          (Impl *this,Hash hash,ResourceTag tag,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  ulong uVar1;
  ulong uVar2;
  pointer __dest;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *__src;
  Value link;
  undefined1 local_118 [16];
  CrtAllocator *pCStack_108;
  char *local_100;
  char *pcStack_f8;
  char *local_f0;
  size_t local_e8;
  int local_e0;
  bool local_dc;
  Data local_d8;
  long local_c8;
  long lStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Data local_a8;
  Data local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_88;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_80;
  Stack<rapidjson::CrtAllocator> local_78;
  undefined4 local_48;
  undefined8 local_40;
  
  local_78.stack_ = (char *)0x0;
  local_78.stackTop_ = (char *)0x0;
  local_78.allocator_ = (CrtAllocator *)0x0;
  local_78.ownAllocator_ = (CrtAllocator *)0x0;
  local_88 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_80 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x0;
  local_78.stackEnd_ = (char *)0x0;
  local_78.initialCapacity_ = 0x400;
  local_48 = 0;
  local_40 = 0;
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  allocator->chunkHead_ = (ChunkHeader *)0x0;
  allocator->chunk_capacity_ = 0x10000;
  allocator->userBuffer_ = (void *)0x0;
  allocator->baseAllocator_ = (CrtAllocator *)0x0;
  allocator->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_d8.s.str = (Ch *)0x405000000151c7d;
  local_d8.n = (Number)0x7;
  local_118._0_8_ = (Number)0x6;
  local_118._8_8_ = (Ch *)0x1f6000000000000;
  local_88 = allocator;
  pMStack_80 = allocator;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_118,allocator);
  local_a8.n = (Number)0x0;
  local_a8.s.str = (Ch *)0x3000000000000;
  uVar1 = (this->application_feature_hash).application_info_hash;
  uVar2 = (this->application_feature_hash).physical_device_features_hash;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_d8.s,
             (uVar2 & 0xffffffff ^
             ((uVar1 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ uVar1 >> 0x20) *
             0x100000001b3) * 0x100000001b3 ^ uVar2 >> 0x20,allocator);
  local_118._8_8_ = (Ch *)0x405000000150cfd;
  local_118._0_8_ = (Number)0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_118,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,allocator);
  local_d8.s.str = (Ch *)0x405000000150d09;
  local_d8.n = (Number)0x3;
  local_118[4] = '\0';
  local_118[5] = '\0';
  local_118[6] = '\0';
  local_118[7] = '\0';
  local_118._0_4_ = tag;
  local_118._8_8_ = (ulong)(-1 < (int)tag) << 0x35 | 0x1d6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_118,allocator);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_d8.s,hash,allocator);
  local_118._8_8_ = (Ch *)0x405000000150d0d;
  local_118._0_8_ = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_118,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,allocator);
  local_118._8_8_ = (Ch *)0x405000000151cd6;
  local_118._0_8_ = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_118,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,allocator);
  local_b8 = 0;
  local_c8 = 0;
  lStack_c0 = 0;
  local_d8.n = (Number)0x0;
  local_d8.s.str = (Ch *)0x0;
  local_b0 = 0x100;
  local_118._8_8_ = (Ch *)0x0;
  pCStack_108 = (CrtAllocator *)0x0;
  local_100 = (char *)0x0;
  pcStack_f8 = (char *)0x0;
  local_f0 = (char *)0x0;
  local_e8 = 0x200;
  local_e0 = 0x144;
  local_dc = false;
  local_118._0_8_ = &local_d8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_98.s,
             (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_118);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(blob,lStack_c0 - local_c8);
  __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_d8.s);
  memcpy(__dest,__src,lStack_c0 - local_c8);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)(local_118 + 8));
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)&local_d8.s);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_98.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
  return true;
}

Assistant:

bool StateRecorder::Impl::serialize_application_blob_link(Hash hash, ResourceTag tag, vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);

	Value links(kArrayType);
	Value link(kObjectType);

	Hasher h;
	Hashing::hash_application_feature_info(h, application_feature_hash);
	link.AddMember("application", uint64_string(h.get(), alloc), alloc);
	link.AddMember("tag", uint32_t(tag), alloc);
	link.AddMember("hash", uint64_string(hash, alloc), alloc);
	doc.AddMember("link", link, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}